

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_string(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  CHAR_DATA *pCVar2;
  char *pcVar3;
  CHAR_DATA *ch_00;
  DESCRIPTOR_DATA *pDVar4;
  AFFECT_DATA *pAVar5;
  NOTE_DATA *pNVar6;
  CHAR_DATA *pCVar7;
  char *in_RSI;
  EXTRA_DESCR_DATA *ed;
  OBJ_DATA *obj;
  CHAR_DATA *victim;
  char arg3 [4608];
  char arg2 [4608];
  char arg1 [4608];
  char type [4608];
  CHAR_DATA *in_stack_ffffffffffffb7c8;
  char *in_stack_ffffffffffffb7d0;
  CHAR_DATA *in_stack_ffffffffffffb7d8;
  CHAR_DATA *in_stack_ffffffffffffb7e0;
  char in_stack_ffffffffffffb7e8;
  undefined7 in_stack_ffffffffffffb7e9;
  CHAR_DATA *in_stack_ffffffffffffb7f0;
  char *in_stack_ffffffffffffb7f8;
  char *in_stack_ffffffffffffc9d0;
  CHAR_DATA *in_stack_ffffffffffffc9d8;
  CHAR_DATA *in_stack_ffffffffffffc9e0;
  char local_3618;
  char *in_stack_ffffffffffffdbd0;
  CHAR_DATA *in_stack_ffffffffffffdbd8;
  char local_2418;
  char local_1218;
  char *in_stack_ffffffffffffffe8;
  
  log_naughty(in_stack_ffffffffffffb7f0,
              (char *)CONCAT71(in_stack_ffffffffffffb7e9,in_stack_ffffffffffffb7e8),
              (int)((ulong)in_stack_ffffffffffffb7e0 >> 0x20));
  smash_tilde(in_RSI);
  one_argument(in_stack_ffffffffffffb7d0,(char *)in_stack_ffffffffffffb7c8);
  one_argument(in_stack_ffffffffffffb7d0,(char *)in_stack_ffffffffffffb7c8);
  pCVar2 = (CHAR_DATA *)one_argument(in_stack_ffffffffffffb7d0,(char *)in_stack_ffffffffffffb7c8);
  strcpy(&stack0xffffffffffffb7e8,(char *)pCVar2);
  if ((((local_1218 == '\0') || (local_2418 == '\0')) || (local_3618 == '\0')) ||
     (in_stack_ffffffffffffb7e8 == '\0')) {
    send_to_char((char *)in_stack_ffffffffffffb7e0,in_stack_ffffffffffffb7d8);
    send_to_char((char *)in_stack_ffffffffffffb7e0,in_stack_ffffffffffffb7d8);
    send_to_char((char *)in_stack_ffffffffffffb7e0,in_stack_ffffffffffffb7d8);
    send_to_char((char *)in_stack_ffffffffffffb7e0,in_stack_ffffffffffffb7d8);
    send_to_char((char *)in_stack_ffffffffffffb7e0,in_stack_ffffffffffffb7d8);
    return;
  }
  bVar1 = str_prefix(in_stack_ffffffffffffb7f8,(char *)in_stack_ffffffffffffb7f0);
  if ((!bVar1) ||
     (bVar1 = str_prefix(in_stack_ffffffffffffb7f8,(char *)in_stack_ffffffffffffb7f0), !bVar1)) {
    in_stack_ffffffffffffb7e0 = get_char_world(in_stack_ffffffffffffdbd8,in_stack_ffffffffffffdbd0);
    if (in_stack_ffffffffffffb7e0 == (CHAR_DATA *)0x0) {
      send_to_char((char *)0x0,in_stack_ffffffffffffb7d8);
      return;
    }
    in_stack_ffffffffffffb7e0->zone = (AREA_DATA_conflict *)0x0;
    bVar1 = str_prefix(in_stack_ffffffffffffb7f8,(char *)in_stack_ffffffffffffb7f0);
    if (!bVar1) {
      free_pstring(in_stack_ffffffffffffb7d0);
      pcVar3 = palloc_string(in_stack_ffffffffffffb7f8);
      in_stack_ffffffffffffb7e0->name = pcVar3;
      return;
    }
    bVar1 = str_prefix(in_stack_ffffffffffffb7f8,(char *)in_stack_ffffffffffffb7f0);
    if (!bVar1) {
      free_pstring(in_stack_ffffffffffffb7d0);
      pcVar3 = palloc_string(in_stack_ffffffffffffb7f8);
      in_stack_ffffffffffffb7e0->description = pcVar3;
      return;
    }
    bVar1 = str_prefix(in_stack_ffffffffffffb7f8,(char *)in_stack_ffffffffffffb7f0);
    if (!bVar1) {
      free_pstring(in_stack_ffffffffffffb7d0);
      pcVar3 = palloc_string(in_stack_ffffffffffffb7f8);
      in_stack_ffffffffffffb7e0->short_descr = pcVar3;
      return;
    }
    bVar1 = str_prefix(in_stack_ffffffffffffb7f8,(char *)in_stack_ffffffffffffb7f0);
    if (!bVar1) {
      free_pstring(in_stack_ffffffffffffb7d0);
      strcat(&stack0xffffffffffffb7e8,"\n\r");
      pcVar3 = palloc_string(in_stack_ffffffffffffb7f8);
      in_stack_ffffffffffffb7e0->long_descr = pcVar3;
      return;
    }
    bVar1 = str_prefix(in_stack_ffffffffffffb7f8,(char *)in_stack_ffffffffffffb7f0);
    if (!bVar1) {
      bVar1 = is_npc(in_stack_ffffffffffffb7c8);
      if (!bVar1) {
        set_title(in_stack_ffffffffffffc9e0,(char *)in_stack_ffffffffffffc9d8);
        return;
      }
      send_to_char((char *)in_stack_ffffffffffffb7e0,in_stack_ffffffffffffb7d8);
      return;
    }
  }
  bVar1 = str_prefix(in_stack_ffffffffffffb7f8,(char *)in_stack_ffffffffffffb7f0);
  if (!bVar1) {
    ch_00 = (CHAR_DATA *)get_obj_world(in_stack_ffffffffffffc9d8,in_stack_ffffffffffffc9d0);
    if (ch_00 == (CHAR_DATA *)0x0) {
      send_to_char((char *)in_stack_ffffffffffffb7e0,(CHAR_DATA *)0x0);
      return;
    }
    bVar1 = str_prefix(in_stack_ffffffffffffb7f8,(char *)in_stack_ffffffffffffb7f0);
    if (!bVar1) {
      free_pstring(in_stack_ffffffffffffb7d0);
      pDVar4 = (DESCRIPTOR_DATA *)palloc_string(in_stack_ffffffffffffb7f8);
      ch_00->desc = pDVar4;
      return;
    }
    bVar1 = str_prefix(in_stack_ffffffffffffb7f8,(char *)in_stack_ffffffffffffb7f0);
    if (!bVar1) {
      free_pstring(in_stack_ffffffffffffb7d0);
      pAVar5 = (AFFECT_DATA *)palloc_string(in_stack_ffffffffffffb7f8);
      ch_00->affected = pAVar5;
      return;
    }
    bVar1 = str_prefix(in_stack_ffffffffffffb7f8,(char *)in_stack_ffffffffffffb7f0);
    if (!bVar1) {
      free_pstring(in_stack_ffffffffffffb7d0);
      pNVar6 = (NOTE_DATA *)palloc_string(in_stack_ffffffffffffb7f8);
      ch_00->pnote = pNVar6;
      return;
    }
    bVar1 = str_prefix(in_stack_ffffffffffffb7f8,(char *)in_stack_ffffffffffffb7f0);
    if ((!bVar1) ||
       (bVar1 = str_prefix(in_stack_ffffffffffffb7f8,(char *)in_stack_ffffffffffffb7f0), !bVar1)) {
      pcVar3 = one_argument(in_stack_ffffffffffffb7d0,(char *)in_stack_ffffffffffffb7c8);
      if (pcVar3 == (char *)0x0) {
        send_to_char((char *)in_stack_ffffffffffffb7e0,ch_00);
        return;
      }
      strcat(pcVar3,"\n\r");
      pCVar2 = (CHAR_DATA *)new_extra_descr();
      pCVar7 = (CHAR_DATA *)palloc_string(in_stack_ffffffffffffb7f8);
      pCVar2->master = pCVar7;
      pCVar7 = (CHAR_DATA *)palloc_string(in_stack_ffffffffffffb7f8);
      pCVar2->leader = pCVar7;
      pCVar2->next = ch_00->pet;
      ch_00->pet = pCVar2;
      return;
    }
  }
  do_string(pCVar2,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void do_string(CHAR_DATA *ch, char *argument)
{
	char type[MAX_INPUT_LENGTH];
	char arg1[MAX_INPUT_LENGTH];
	char arg2[MAX_INPUT_LENGTH];
	char arg3[MAX_INPUT_LENGTH];
	CHAR_DATA *victim;
	OBJ_DATA *obj;
	log_naughty(ch, argument, 3);
	smash_tilde(argument);
	argument = one_argument(argument, type);
	argument = one_argument(argument, arg1);
	argument = one_argument(argument, arg2);
	strcpy(arg3, argument);

	if (type[0] == '\0' || arg1[0] == '\0' || arg2[0] == '\0' || arg3[0] == '\0')
	{
		send_to_char("Syntax:\n\r", ch);
		send_to_char("  string char <name> <field> <string>\n\r", ch);
		send_to_char("    fields: name short long desc title spec\n\r", ch);
		send_to_char("  string obj  <name> <field> <string>\n\r", ch);
		send_to_char("    fields: name short long extended\n\r", ch);
		return;
	}

	if (!str_prefix(type, "character") || !str_prefix(type, "mobile"))
	{
		victim = get_char_world(ch, arg1);

		if (victim == nullptr)
		{
			send_to_char("They aren't here.\n\r", ch);
			return;
		}

		/* clear zone for mobs */
		victim->zone = nullptr;

		/* string something */

		if (!str_prefix(arg2, "name"))
		{
			free_pstring(victim->name);
			victim->name = palloc_string(arg3);
			return;
		}

		if (!str_prefix(arg2, "description"))
		{
			free_pstring(victim->description);
			victim->description = palloc_string(arg3);
			return;
		}

		if (!str_prefix(arg2, "short"))
		{
			free_pstring(victim->short_descr);
			victim->short_descr = palloc_string(arg3);
			return;
		}

		if (!str_prefix(arg2, "long"))
		{
			free_pstring(victim->long_descr);
			strcat(arg3, "\n\r");
			victim->long_descr = palloc_string(arg3);
			return;
		}

		if (!str_prefix(arg2, "title"))
		{
			if (is_npc(victim))
			{
				send_to_char("Not on NPC's.\n\r", ch);
				return;
			}

			set_title(victim, arg3);
			return;
		}
	}

	if (!str_prefix(type, "object"))
	{
		/* string an obj */
		obj = get_obj_world(ch, arg1);

		if (obj == nullptr)
		{
			send_to_char("Nothing like that in heaven or earth.\n\r", ch);
			return;
		}

		if (!str_prefix(arg2, "name"))
		{
			free_pstring(obj->name);
			obj->name = palloc_string(arg3);
			return;
		}

		if (!str_prefix(arg2, "short"))
		{
			free_pstring(obj->short_descr);
			obj->short_descr = palloc_string(arg3);
			return;
		}

		if (!str_prefix(arg2, "long"))
		{
			free_pstring(obj->description);
			obj->description = palloc_string(arg3);
			return;
		}

		if (!str_prefix(arg2, "ed") || !str_prefix(arg2, "extended"))
		{
			EXTRA_DESCR_DATA *ed;

			argument = one_argument(argument, arg3);

			if (argument == nullptr)
			{
				send_to_char("Syntax: oset <object> ed <keyword> <string>\n\r", ch);
				return;
			}

			strcat(argument, "\n\r");

			ed = new_extra_descr();

			ed->keyword = palloc_string(arg3);
			ed->description = palloc_string(argument);
			ed->next = obj->extra_descr;
			obj->extra_descr = ed;
			return;
		}
	}

	/* echo bad use message */
	do_string(ch, "");
}